

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractBorder
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  BorderStyle BVar4;
  ValueExtractor *this_00;
  qsizetype qVar5;
  ValueExtractor *this_01;
  DeclarationData *pDVar6;
  QSize QVar7;
  ValueExtractor *in_RCX;
  QBrush *this_02;
  int *in_RSI;
  ValueExtractor *in_RDI;
  QSize *in_R8;
  long in_FS_OFFSET;
  Declaration *decl;
  int i;
  bool hit;
  QBrush *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  int iVar8;
  uint in_stack_ffffffffffffff8c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  extractFont((ValueExtractor *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
  iVar8 = 0;
  do {
    this_00 = (ValueExtractor *)(long)iVar8;
    qVar5 = QList<QCss::Declaration>::size(&in_RDI->declarations);
    if (qVar5 <= (long)this_00) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return (bool)((byte)(in_stack_ffffffffffffff8c >> 0x18) & 1);
      }
      __stack_chk_fail();
    }
    this_01 = (ValueExtractor *)
              QList<QCss::Declaration>::at
                        ((QList<QCss::Declaration> *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (qsizetype)in_stack_ffffffffffffff58);
    pDVar6 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f083
                       );
    this_02 = (QBrush *)(ulong)(pDVar6->propertyId - Border);
    switch(this_02) {
    case (QBrush *)0x0:
      borderValue(in_RCX,(Declaration *)in_R8,(int *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),
                  (BorderStyle *)this_01,(QBrush *)in_RDI);
      iVar3 = in_RSI[3];
      in_RSI[2] = iVar3;
      in_RSI[1] = iVar3;
      *in_RSI = iVar3;
      uVar1 = *(undefined4 *)((long)&(in_RCX->declarations).d.ptr + 4);
      *(undefined4 *)&(in_RCX->declarations).d.ptr = uVar1;
      *(undefined4 *)((long)&(in_RCX->declarations).d.d + 4) = uVar1;
      *(undefined4 *)&(in_RCX->declarations).d.d = uVar1;
      QBrush::operator=(this_02,(QBrush *)
                                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QBrush::operator=(this_02,(QBrush *)
                                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QBrush::operator=(this_02,(QBrush *)
                                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      break;
    case (QBrush *)0x1:
      borderValue(in_RCX,(Declaration *)in_R8,(int *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),
                  (BorderStyle *)this_01,(QBrush *)in_RDI);
      break;
    case (QBrush *)0x2:
      borderValue(in_RCX,(Declaration *)in_R8,(int *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),
                  (BorderStyle *)this_01,(QBrush *)in_RDI);
      break;
    case (QBrush *)0x3:
      borderValue(in_RCX,(Declaration *)in_R8,(int *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),
                  (BorderStyle *)this_01,(QBrush *)in_RDI);
      break;
    case (QBrush *)0x4:
      borderValue(in_RCX,(Declaration *)in_R8,(int *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),
                  (BorderStyle *)this_01,(QBrush *)in_RDI);
      break;
    default:
      goto LAB_00a2f4e5;
    case (QBrush *)0xe:
      BVar4 = Declaration::styleValue((Declaration *)in_stack_ffffffffffffff58);
      *(BorderStyle *)((long)&(in_RCX->declarations).d.ptr + 4) = BVar4;
      break;
    case (QBrush *)0xf:
      BVar4 = Declaration::styleValue((Declaration *)in_stack_ffffffffffffff58);
      *(BorderStyle *)((long)&(in_RCX->declarations).d.d + 4) = BVar4;
      break;
    case (QBrush *)0x10:
      BVar4 = Declaration::styleValue((Declaration *)in_stack_ffffffffffffff58);
      *(BorderStyle *)&(in_RCX->declarations).d.d = BVar4;
      break;
    case (QBrush *)0x11:
      BVar4 = Declaration::styleValue((Declaration *)in_stack_ffffffffffffff58);
      *(BorderStyle *)&(in_RCX->declarations).d.ptr = BVar4;
      break;
    case (QBrush *)0x12:
      Declaration::styleValues((Declaration *)in_RDI,(BorderStyle *)this_00);
      break;
    case (QBrush *)0x13:
      Declaration::brushValue
                ((Declaration *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),(QPalette *)this_01);
      QBrush::operator=((QBrush *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
      QBrush::~QBrush((QBrush *)0xa2f17d);
      break;
    case (QBrush *)0x14:
      Declaration::brushValue
                ((Declaration *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),(QPalette *)this_01);
      QBrush::operator=((QBrush *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
      QBrush::~QBrush((QBrush *)0xa2f1c0);
      break;
    case (QBrush *)0x15:
      Declaration::brushValue
                ((Declaration *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),(QPalette *)this_01);
      QBrush::operator=((QBrush *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
      QBrush::~QBrush((QBrush *)0xa2f1ff);
      break;
    case (QBrush *)0x16:
      Declaration::brushValue
                ((Declaration *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),(QPalette *)this_01);
      QBrush::operator=((QBrush *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
      QBrush::~QBrush((QBrush *)0xa2f242);
      break;
    case (QBrush *)0x17:
      Declaration::brushValues
                ((Declaration *)in_R8,(QBrush *)CONCAT44(in_stack_ffffffffffffff8c,iVar8),
                 (QPalette *)this_01);
      break;
    case (QBrush *)0x18:
      iVar3 = lengthValue(this_00,(Declaration *)this_02);
      in_RSI[3] = iVar3;
      break;
    case (QBrush *)0x19:
      iVar3 = lengthValue(this_00,(Declaration *)this_02);
      in_RSI[1] = iVar3;
      break;
    case (QBrush *)0x1a:
      iVar3 = lengthValue(this_00,(Declaration *)this_02);
      *in_RSI = iVar3;
      break;
    case (QBrush *)0x1b:
      iVar3 = lengthValue(this_00,(Declaration *)this_02);
      in_RSI[2] = iVar3;
      break;
    case (QBrush *)0x1c:
      lengthValues(in_RDI,(Declaration *)this_00,(int *)this_02);
      break;
    case (QBrush *)0x1d:
      QVar7 = sizeValue(this_01,(Declaration *)in_RDI);
      *in_R8 = QVar7;
      break;
    case (QBrush *)0x1e:
      QVar7 = sizeValue(this_01,(Declaration *)in_RDI);
      in_R8[1] = QVar7;
      break;
    case (QBrush *)0x1f:
      QVar7 = sizeValue(this_01,(Declaration *)in_RDI);
      in_R8[2] = QVar7;
      break;
    case (QBrush *)0x20:
      QVar7 = sizeValue(this_01,(Declaration *)in_RDI);
      in_R8[3] = QVar7;
      break;
    case (QBrush *)0x21:
      sizeValues(this_00,(Declaration *)this_02,
                 (QSize *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    }
    in_stack_ffffffffffffff8c = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
LAB_00a2f4e5:
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractBorder(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case BorderLeftWidth: borders[LeftEdge] = lengthValue(decl); break;
        case BorderRightWidth: borders[RightEdge] = lengthValue(decl); break;
        case BorderTopWidth: borders[TopEdge] = lengthValue(decl); break;
        case BorderBottomWidth: borders[BottomEdge] = lengthValue(decl); break;
        case BorderWidth: lengthValues(decl, borders); break;

        case BorderLeftColor: colors[LeftEdge] = decl.brushValue(pal); break;
        case BorderRightColor: colors[RightEdge] = decl.brushValue(pal); break;
        case BorderTopColor: colors[TopEdge] = decl.brushValue(pal); break;
        case BorderBottomColor: colors[BottomEdge] = decl.brushValue(pal); break;
        case BorderColor: decl.brushValues(colors, pal); break;

        case BorderTopStyle: styles[TopEdge] = decl.styleValue(); break;
        case BorderBottomStyle: styles[BottomEdge] = decl.styleValue(); break;
        case BorderLeftStyle: styles[LeftEdge] = decl.styleValue(); break;
        case BorderRightStyle: styles[RightEdge] = decl.styleValue(); break;
        case BorderStyles:  decl.styleValues(styles); break;

        case BorderTopLeftRadius: radii[0] = sizeValue(decl); break;
        case BorderTopRightRadius: radii[1] = sizeValue(decl); break;
        case BorderBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case BorderBottomRightRadius: radii[3] = sizeValue(decl); break;
        case BorderRadius: sizeValues(decl, radii); break;

        case BorderLeft:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            break;
        case BorderTop:
            borderValue(decl, &borders[TopEdge], &styles[TopEdge], &colors[TopEdge]);
            break;
        case BorderRight:
            borderValue(decl, &borders[RightEdge], &styles[RightEdge], &colors[RightEdge]);
            break;
        case BorderBottom:
            borderValue(decl, &borders[BottomEdge], &styles[BottomEdge], &colors[BottomEdge]);
            break;
        case Border:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}